

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::ProcessInst(RelaxFloatOpsPass *this,Instruction *r_inst)

{
  bool bVar1;
  uint32_t r_id;
  DecorationManager *this_00;
  
  r_id = Instruction::result_id(r_inst);
  if ((((r_id != 0) && (bVar1 = IsFloat32(this,r_inst), bVar1)) &&
      (bVar1 = IsRelaxed(this,r_id), !bVar1)) && (bVar1 = IsRelaxable(this,r_inst), bVar1)) {
    this_00 = Pass::get_decoration_mgr(&this->super_Pass);
    analysis::DecorationManager::AddDecoration(this_00,r_id,0);
    return true;
  }
  return false;
}

Assistant:

bool RelaxFloatOpsPass::ProcessInst(Instruction* r_inst) {
  uint32_t r_id = r_inst->result_id();
  if (r_id == 0) return false;
  if (!IsFloat32(r_inst)) return false;
  if (IsRelaxed(r_id)) return false;
  if (!IsRelaxable(r_inst)) return false;
  get_decoration_mgr()->AddDecoration(
      r_id, uint32_t(spv::Decoration::RelaxedPrecision));
  return true;
}